

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O0

bool __thiscall ON_ArchivableDictionary::ContainsKey(ON_ArchivableDictionary *this,wchar_t *key)

{
  bool bVar1;
  _Self local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
  local_20;
  wchar_t *local_18;
  wchar_t *key_local;
  ON_ArchivableDictionary *this_local;
  
  local_18 = key;
  key_local = (wchar_t *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<ON_wString,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>,std::less<void>,std::allocator<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>>
       ::find<wchar_t_const*>
                 ((map<ON_wString,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>,std::less<void>,std::allocator<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>>
                   *)&this->m_private->m_map,&local_18);
  std::
  _Rb_tree_const_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
  ::_Rb_tree_const_iterator(&local_20,&local_28);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
       ::cend(&this->m_private->m_map);
  bVar1 = std::operator!=(&local_20,&local_30);
  return bVar1;
}

Assistant:

bool ON_ArchivableDictionary::ContainsKey(const wchar_t* key) const
{
  return m_private->m_map.find(key) != m_private->m_map.cend();
}